

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  undefined8 *puVar1;
  void *pvVar2;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x60 - uVar4 != 0; uVar4 = uVar4 + 0x60) {
    pvVar2 = *(void **)((long)&z->img_comp[0].raw_data + uVar4);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      puVar1 = (undefined8 *)((long)&z->img_comp[0].data + uVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      in_EAX = extraout_EAX;
    }
    pvVar2 = *(void **)((long)&z->img_comp[0].raw_coeff + uVar4);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)&z->img_comp[0].raw_coeff + uVar4) = 0;
      *(undefined8 *)((long)&z->img_comp[0].coeff + uVar4) = 0;
      in_EAX = extraout_EAX_00;
    }
    pvVar2 = *(void **)((long)&z->img_comp[0].linebuf + uVar4);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)&z->img_comp[0].linebuf + uVar4) = 0;
      in_EAX = extraout_EAX_01;
    }
  }
  return in_EAX;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}